

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O3

REF_STATUS
ref_cell_part_cell_node(REF_CELL ref_cell,REF_NODE ref_node,REF_INT cell,REF_INT *cell_node)

{
  REF_INT *pRVar1;
  uint uVar2;
  int iVar3;
  REF_STATUS RVar4;
  long lVar5;
  REF_INT RVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  *cell_node = -1;
  RVar4 = 3;
  if ((-1 < cell) && (cell <= ref_cell->max)) {
    lVar8 = (long)cell * (long)ref_cell->size_per;
    uVar2 = ref_cell->c2n[lVar8];
    RVar4 = 3;
    if ((ulong)uVar2 != 0xffffffff) {
      lVar5 = -1;
      if (((-1 < (int)uVar2) && ((int)uVar2 < ref_node->max)) && (-1 < ref_node->global[uVar2])) {
        lVar5 = ref_node->global[uVar2];
      }
      RVar4 = 0;
      RVar6 = 0;
      if (1 < (long)ref_cell->node_per) {
        pRVar1 = ref_cell->c2n + lVar8;
        uVar7 = 0;
        uVar9 = 1;
        do {
          iVar3 = pRVar1[uVar9];
          lVar8 = -1;
          if (((-1 < (long)iVar3) && (iVar3 < ref_node->max)) &&
             (lVar8 = ref_node->global[iVar3], lVar8 < 0)) {
            lVar8 = -1;
          }
          if (lVar8 < lVar5) {
            uVar7 = uVar9 & 0xffffffff;
            lVar5 = lVar8;
          }
          RVar6 = (REF_INT)uVar7;
          uVar9 = uVar9 + 1;
        } while ((long)ref_cell->node_per != uVar9);
        if (RVar6 == -1) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                 0x38a,"ref_cell_part_cell_node","node is empty?",pRVar1,3);
          return 1;
        }
      }
      *cell_node = RVar6;
    }
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_cell_part_cell_node(REF_CELL ref_cell, REF_NODE ref_node,
                                           REF_INT cell, REF_INT *cell_node) {
  REF_GLOB global, smallest_global;
  REF_INT node, smallest_global_node;
  *cell_node = REF_EMPTY;
  if (cell < 0 || cell > ref_cell_max(ref_cell)) return REF_INVALID;
  if (REF_EMPTY == ref_cell_c2n(ref_cell, 0, cell)) return REF_INVALID;
  /* set first node as smallest */
  node = 0;
  global = ref_node_global(ref_node, ref_cell_c2n(ref_cell, node, cell));
  smallest_global = global;
  smallest_global_node = node;
  /* search other nodes for smaller global */
  for (node = 1; node < ref_cell_node_per(ref_cell); node++) {
    global = ref_node_global(ref_node, ref_cell_c2n(ref_cell, node, cell));
    if (global < smallest_global) {
      smallest_global = global;
      smallest_global_node = node;
    }
  }
  RUS(REF_EMPTY, smallest_global_node, "node is empty?");
  *cell_node = smallest_global_node;
  return REF_SUCCESS;
}